

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersectorKHybrid<8,_8,_16777232,_false,_embree::avx512::ArrayIntersectorK_1<8,_embree::avx512::ObjectIntersectorK<8,_true>_>,_false>
     ::intersect(vint<8> *valid_i,Intersectors *This,RayHitK<8> *ray,RayQueryContext *context)

{
  undefined1 (*pauVar1) [32];
  undefined4 uVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  undefined8 uVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  ulong uVar23;
  _func_int **pp_Var24;
  long lVar25;
  ulong uVar26;
  AABBNodeMB4D *node1;
  ulong uVar27;
  uint uVar28;
  ulong uVar29;
  ulong *puVar30;
  undefined1 (*pauVar31) [32];
  ulong uVar32;
  ushort uVar33;
  ulong uVar34;
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  vint<8> mask;
  NodeRef stack_node [561];
  vfloat<8> stack_near [561];
  RTCIntersectFunctionNArguments local_5988;
  Geometry *local_5958;
  undefined8 local_5950;
  RTCIntersectArguments *local_5948;
  undefined1 local_5940 [32];
  undefined1 local_5920 [32];
  undefined1 local_5900 [32];
  undefined1 local_58e0 [32];
  undefined1 local_58c0 [32];
  undefined1 local_58a0 [32];
  undefined1 local_5880 [32];
  undefined1 local_5860 [32];
  undefined1 local_5840 [32];
  undefined8 uStack_5810;
  ulong local_5808 [561];
  undefined1 local_4680 [32];
  undefined1 local_4660 [32];
  undefined1 local_4640 [17936];
  
  uVar29 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (uVar29 != 8) {
    auVar38 = vpcmpeqd_avx2(in_ZMM1._0_32_,in_ZMM1._0_32_);
    uVar23 = vpcmpeqd_avx512vl((undefined1  [32])valid_i->field_0,auVar38);
    if ((byte)uVar23 != 0) {
      auVar38 = *(undefined1 (*) [32])(ray + 0x80);
      auVar36 = *(undefined1 (*) [32])(ray + 0xa0);
      auVar37 = *(undefined1 (*) [32])(ray + 0xc0);
      local_4680._8_4_ = 0x7f800000;
      local_4680._0_8_ = 0x7f8000007f800000;
      local_4680._12_4_ = 0x7f800000;
      local_4680._16_4_ = 0x7f800000;
      local_4680._20_4_ = 0x7f800000;
      local_4680._24_4_ = 0x7f800000;
      local_4680._28_4_ = 0x7f800000;
      auVar58 = ZEXT3264(local_4680);
      auVar35 = *(undefined1 (*) [32])ray;
      auVar39._0_8_ = auVar35._0_8_ ^ 0x8000000080000000;
      auVar39._8_4_ = auVar35._8_4_ ^ 0x80000000;
      auVar39._12_4_ = auVar35._12_4_ ^ 0x80000000;
      auVar39._16_4_ = auVar35._16_4_ ^ 0x80000000;
      auVar39._20_4_ = auVar35._20_4_ ^ 0x80000000;
      auVar39._24_4_ = auVar35._24_4_ ^ 0x80000000;
      auVar39._28_4_ = auVar35._28_4_ ^ 0x80000000;
      auVar35 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x60),
                                SUB6432(ZEXT1664((undefined1  [16])0x0),0));
      bVar3 = (bool)((byte)uVar23 & 1);
      local_58e0._0_4_ = (uint)bVar3 * auVar35._0_4_ | (uint)!bVar3 * 0x7f800000;
      bVar3 = (bool)((byte)(uVar23 >> 1) & 1);
      local_58e0._4_4_ = (uint)bVar3 * auVar35._4_4_ | (uint)!bVar3 * 0x7f800000;
      bVar3 = (bool)((byte)(uVar23 >> 2) & 1);
      local_58e0._8_4_ = (uint)bVar3 * auVar35._8_4_ | (uint)!bVar3 * 0x7f800000;
      bVar3 = (bool)((byte)(uVar23 >> 3) & 1);
      local_58e0._12_4_ = (uint)bVar3 * auVar35._12_4_ | (uint)!bVar3 * 0x7f800000;
      bVar3 = (bool)((byte)(uVar23 >> 4) & 1);
      local_58e0._16_4_ = (uint)bVar3 * auVar35._16_4_ | (uint)!bVar3 * 0x7f800000;
      bVar3 = (bool)((byte)(uVar23 >> 5) & 1);
      local_58e0._20_4_ = (uint)bVar3 * auVar35._20_4_ | (uint)!bVar3 * 0x7f800000;
      bVar3 = (bool)((byte)(uVar23 >> 6) & 1);
      local_58e0._24_4_ = (uint)bVar3 * auVar35._24_4_ | (uint)!bVar3 * 0x7f800000;
      bVar3 = SUB81(uVar23 >> 7,0);
      local_58e0._28_4_ = (uint)bVar3 * auVar35._28_4_ | (uint)!bVar3 * 0x7f800000;
      auVar59 = ZEXT3264(local_58e0);
      auVar35 = *(undefined1 (*) [32])(ray + 0x20);
      auVar40._0_8_ = auVar35._0_8_ ^ 0x8000000080000000;
      auVar40._8_4_ = auVar35._8_4_ ^ 0x80000000;
      auVar40._12_4_ = auVar35._12_4_ ^ 0x80000000;
      auVar40._16_4_ = auVar35._16_4_ ^ 0x80000000;
      auVar40._20_4_ = auVar35._20_4_ ^ 0x80000000;
      auVar40._24_4_ = auVar35._24_4_ ^ 0x80000000;
      auVar40._28_4_ = auVar35._28_4_ ^ 0x80000000;
      auVar35 = *(undefined1 (*) [32])(ray + 0x40);
      auVar41._0_8_ = auVar35._0_8_ ^ 0x8000000080000000;
      auVar41._8_4_ = auVar35._8_4_ ^ 0x80000000;
      auVar41._12_4_ = auVar35._12_4_ ^ 0x80000000;
      auVar41._16_4_ = auVar35._16_4_ ^ 0x80000000;
      auVar41._20_4_ = auVar35._20_4_ ^ 0x80000000;
      auVar41._24_4_ = auVar35._24_4_ ^ 0x80000000;
      auVar41._28_4_ = auVar35._28_4_ ^ 0x80000000;
      uStack_5810 = 0xfffffffffffffff8;
      local_5808[0] = uVar29;
      local_4660 = local_58e0;
      if (uVar29 != 0xfffffffffffffff8) {
        auVar43._8_4_ = 0x7fffffff;
        auVar43._0_8_ = 0x7fffffff7fffffff;
        auVar43._12_4_ = 0x7fffffff;
        auVar43._16_4_ = 0x7fffffff;
        auVar43._20_4_ = 0x7fffffff;
        auVar43._24_4_ = 0x7fffffff;
        auVar43._28_4_ = 0x7fffffff;
        auVar35 = vandps_avx(auVar38,auVar43);
        auVar45._8_4_ = 0x219392ef;
        auVar45._0_8_ = 0x219392ef219392ef;
        auVar45._12_4_ = 0x219392ef;
        auVar45._16_4_ = 0x219392ef;
        auVar45._20_4_ = 0x219392ef;
        auVar45._24_4_ = 0x219392ef;
        auVar45._28_4_ = 0x219392ef;
        uVar23 = vcmpps_avx512vl(auVar35,auVar45,1);
        bVar3 = (bool)((byte)uVar23 & 1);
        auVar35._0_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar38._0_4_;
        bVar3 = (bool)((byte)(uVar23 >> 1) & 1);
        auVar35._4_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar38._4_4_;
        bVar3 = (bool)((byte)(uVar23 >> 2) & 1);
        auVar35._8_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar38._8_4_;
        bVar3 = (bool)((byte)(uVar23 >> 3) & 1);
        auVar35._12_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar38._12_4_;
        bVar3 = (bool)((byte)(uVar23 >> 4) & 1);
        auVar35._16_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar38._16_4_;
        bVar3 = (bool)((byte)(uVar23 >> 5) & 1);
        auVar35._20_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar38._20_4_;
        bVar3 = (bool)((byte)(uVar23 >> 6) & 1);
        auVar35._24_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar38._24_4_;
        bVar3 = SUB81(uVar23 >> 7,0);
        auVar35._28_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar38._28_4_;
        auVar38 = vandps_avx(auVar36,auVar43);
        uVar23 = vcmpps_avx512vl(auVar38,auVar45,1);
        bVar3 = (bool)((byte)uVar23 & 1);
        auVar42._0_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar36._0_4_;
        bVar3 = (bool)((byte)(uVar23 >> 1) & 1);
        auVar42._4_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar36._4_4_;
        bVar3 = (bool)((byte)(uVar23 >> 2) & 1);
        auVar42._8_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar36._8_4_;
        bVar3 = (bool)((byte)(uVar23 >> 3) & 1);
        auVar42._12_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar36._12_4_;
        bVar3 = (bool)((byte)(uVar23 >> 4) & 1);
        auVar42._16_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar36._16_4_;
        bVar3 = (bool)((byte)(uVar23 >> 5) & 1);
        auVar42._20_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar36._20_4_;
        bVar3 = (bool)((byte)(uVar23 >> 6) & 1);
        auVar42._24_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar36._24_4_;
        bVar3 = SUB81(uVar23 >> 7,0);
        auVar42._28_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar36._28_4_;
        auVar38 = vandps_avx(auVar37,auVar43);
        uVar23 = vcmpps_avx512vl(auVar38,auVar45,1);
        bVar3 = (bool)((byte)uVar23 & 1);
        auVar38._0_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar37._0_4_;
        bVar3 = (bool)((byte)(uVar23 >> 1) & 1);
        auVar38._4_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar37._4_4_;
        bVar3 = (bool)((byte)(uVar23 >> 2) & 1);
        auVar38._8_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar37._8_4_;
        bVar3 = (bool)((byte)(uVar23 >> 3) & 1);
        auVar38._12_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar37._12_4_;
        bVar3 = (bool)((byte)(uVar23 >> 4) & 1);
        auVar38._16_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar37._16_4_;
        bVar3 = (bool)((byte)(uVar23 >> 5) & 1);
        auVar38._20_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar37._20_4_;
        bVar3 = (bool)((byte)(uVar23 >> 6) & 1);
        auVar38._24_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar37._24_4_;
        bVar3 = SUB81(uVar23 >> 7,0);
        auVar38._28_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * auVar37._28_4_;
        auVar36 = vrcp14ps_avx512vl(auVar35);
        auVar44._8_4_ = 0x3f800000;
        auVar44._0_8_ = 0x3f8000003f800000;
        auVar44._12_4_ = 0x3f800000;
        auVar44._16_4_ = 0x3f800000;
        auVar44._20_4_ = 0x3f800000;
        auVar44._24_4_ = 0x3f800000;
        auVar44._28_4_ = 0x3f800000;
        auVar13 = vfnmadd213ps_fma(auVar35,auVar36,auVar44);
        auVar37 = vrcp14ps_avx512vl(auVar42);
        auVar14 = vfnmadd213ps_fma(auVar42,auVar37,auVar44);
        auVar35 = vrcp14ps_avx512vl(auVar38);
        auVar15 = vfnmadd213ps_fma(auVar38,auVar35,auVar44);
        auVar13 = vfmadd132ps_fma(ZEXT1632(auVar13),auVar36,auVar36);
        auVar55 = ZEXT1664(auVar13);
        auVar14 = vfmadd132ps_fma(ZEXT1632(auVar14),auVar37,auVar37);
        auVar56 = ZEXT1664(auVar14);
        auVar15 = vfmadd132ps_fma(ZEXT1632(auVar15),auVar35,auVar35);
        auVar57 = ZEXT1664(auVar15);
        local_5880 = ZEXT1632(auVar13);
        local_5900 = vmulps_avx512vl(local_5880,auVar39);
        auVar60 = ZEXT3264(local_5900);
        local_58a0 = ZEXT1632(auVar14);
        local_5920 = vmulps_avx512vl(local_58a0,auVar40);
        auVar61 = ZEXT3264(local_5920);
        local_58c0 = ZEXT1632(auVar15);
        local_5940 = vmulps_avx512vl(local_58c0,auVar41);
        auVar62 = ZEXT3264(local_5940);
        auVar38 = vpcmpeqd_avx2(auVar39,auVar39);
        uVar23 = vpcmpeqd_avx512vl((undefined1  [32])valid_i->field_0,auVar38);
        puVar30 = local_5808;
        auVar38 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar36 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),
                                  SUB6432(ZEXT1664((undefined1  [16])0x0),0));
        bVar3 = (bool)((byte)uVar23 & 1);
        bVar4 = (bool)((byte)(uVar23 >> 1) & 1);
        bVar5 = (bool)((byte)(uVar23 >> 2) & 1);
        bVar6 = (bool)((byte)(uVar23 >> 3) & 1);
        bVar7 = (bool)((byte)(uVar23 >> 4) & 1);
        bVar8 = (bool)((byte)(uVar23 >> 5) & 1);
        bVar9 = (bool)((byte)(uVar23 >> 6) & 1);
        bVar10 = SUB81(uVar23 >> 7,0);
        auVar63 = ZEXT3264(CONCAT428((uint)bVar10 * auVar36._28_4_ | (uint)!bVar10 * auVar38._28_4_,
                                     CONCAT424((uint)bVar9 * auVar36._24_4_ |
                                               (uint)!bVar9 * auVar38._24_4_,
                                               CONCAT420((uint)bVar8 * auVar36._20_4_ |
                                                         (uint)!bVar8 * auVar38._20_4_,
                                                         CONCAT416((uint)bVar7 * auVar36._16_4_ |
                                                                   (uint)!bVar7 * auVar38._16_4_,
                                                                   CONCAT412((uint)bVar6 *
                                                                             auVar36._12_4_ |
                                                                             (uint)!bVar6 *
                                                                             auVar38._12_4_,
                                                                             CONCAT48((uint)bVar5 *
                                                                                      auVar36._8_4_
                                                                                      | (uint)!bVar5
                                                                                        * auVar38.
                                                  _8_4_,CONCAT44((uint)bVar4 * auVar36._4_4_ |
                                                                 (uint)!bVar4 * auVar38._4_4_,
                                                                 (uint)bVar3 * auVar36._0_4_ |
                                                                 (uint)!bVar3 * auVar38._0_4_)))))))
                          );
        pauVar31 = (undefined1 (*) [32])local_4640;
        do {
          pauVar1 = pauVar31 + -1;
          auVar48 = ZEXT3264(*pauVar1);
          pauVar31 = pauVar31 + -1;
          auVar38 = auVar63._0_32_;
          uVar11 = vcmpps_avx512vl(*pauVar1,auVar38,1);
          if ((char)uVar11 != '\0') {
            while( true ) {
              uVar28 = (uint)uVar29;
              auVar36 = auVar48._0_32_;
              if ((uVar29 & 8) != 0) break;
              uVar27 = uVar29 & 0xfffffffffffffff0;
              uVar23 = 0;
              auVar48 = ZEXT3264(auVar58._0_32_);
              lVar25 = -0x20;
              uVar29 = 8;
              do {
                uVar32 = *(ulong *)(uVar27 + 0x40 + lVar25 * 2);
                if (uVar32 == 8) break;
                uVar2 = *(undefined4 *)(uVar27 + 0x120 + lVar25);
                auVar49._4_4_ = uVar2;
                auVar49._0_4_ = uVar2;
                auVar49._8_4_ = uVar2;
                auVar49._12_4_ = uVar2;
                auVar49._16_4_ = uVar2;
                auVar49._20_4_ = uVar2;
                auVar49._24_4_ = uVar2;
                auVar49._28_4_ = uVar2;
                auVar37 = *(undefined1 (*) [32])(ray + 0xe0);
                uVar2 = *(undefined4 *)(uVar27 + 0x60 + lVar25);
                auVar46._4_4_ = uVar2;
                auVar46._0_4_ = uVar2;
                auVar46._8_4_ = uVar2;
                auVar46._12_4_ = uVar2;
                auVar46._16_4_ = uVar2;
                auVar46._20_4_ = uVar2;
                auVar46._24_4_ = uVar2;
                auVar46._28_4_ = uVar2;
                auVar35 = vfmadd213ps_avx512vl(auVar49,auVar37,auVar46);
                uVar2 = *(undefined4 *)(uVar27 + 0x160 + lVar25);
                auVar50._4_4_ = uVar2;
                auVar50._0_4_ = uVar2;
                auVar50._8_4_ = uVar2;
                auVar50._12_4_ = uVar2;
                auVar50._16_4_ = uVar2;
                auVar50._20_4_ = uVar2;
                auVar50._24_4_ = uVar2;
                auVar50._28_4_ = uVar2;
                uVar2 = *(undefined4 *)(uVar27 + 0xa0 + lVar25);
                auVar16._4_4_ = uVar2;
                auVar16._0_4_ = uVar2;
                auVar16._8_4_ = uVar2;
                auVar16._12_4_ = uVar2;
                auVar16._16_4_ = uVar2;
                auVar16._20_4_ = uVar2;
                auVar16._24_4_ = uVar2;
                auVar16._28_4_ = uVar2;
                auVar39 = vfmadd213ps_avx512vl(auVar50,auVar37,auVar16);
                uVar2 = *(undefined4 *)(uVar27 + 0x1a0 + lVar25);
                auVar51._4_4_ = uVar2;
                auVar51._0_4_ = uVar2;
                auVar51._8_4_ = uVar2;
                auVar51._12_4_ = uVar2;
                auVar51._16_4_ = uVar2;
                auVar51._20_4_ = uVar2;
                auVar51._24_4_ = uVar2;
                auVar51._28_4_ = uVar2;
                uVar2 = *(undefined4 *)(uVar27 + 0xe0 + lVar25);
                auVar17._4_4_ = uVar2;
                auVar17._0_4_ = uVar2;
                auVar17._8_4_ = uVar2;
                auVar17._12_4_ = uVar2;
                auVar17._16_4_ = uVar2;
                auVar17._20_4_ = uVar2;
                auVar17._24_4_ = uVar2;
                auVar17._28_4_ = uVar2;
                auVar40 = vfmadd213ps_avx512vl(auVar51,auVar37,auVar17);
                uVar2 = *(undefined4 *)(uVar27 + 0x140 + lVar25);
                auVar52._4_4_ = uVar2;
                auVar52._0_4_ = uVar2;
                auVar52._8_4_ = uVar2;
                auVar52._12_4_ = uVar2;
                auVar52._16_4_ = uVar2;
                auVar52._20_4_ = uVar2;
                auVar52._24_4_ = uVar2;
                auVar52._28_4_ = uVar2;
                uVar2 = *(undefined4 *)(uVar27 + 0x80 + lVar25);
                auVar18._4_4_ = uVar2;
                auVar18._0_4_ = uVar2;
                auVar18._8_4_ = uVar2;
                auVar18._12_4_ = uVar2;
                auVar18._16_4_ = uVar2;
                auVar18._20_4_ = uVar2;
                auVar18._24_4_ = uVar2;
                auVar18._28_4_ = uVar2;
                auVar41 = vfmadd213ps_avx512vl(auVar52,auVar37,auVar18);
                uVar2 = *(undefined4 *)(uVar27 + 0x180 + lVar25);
                auVar53._4_4_ = uVar2;
                auVar53._0_4_ = uVar2;
                auVar53._8_4_ = uVar2;
                auVar53._12_4_ = uVar2;
                auVar53._16_4_ = uVar2;
                auVar53._20_4_ = uVar2;
                auVar53._24_4_ = uVar2;
                auVar53._28_4_ = uVar2;
                uVar2 = *(undefined4 *)(uVar27 + 0xc0 + lVar25);
                auVar19._4_4_ = uVar2;
                auVar19._0_4_ = uVar2;
                auVar19._8_4_ = uVar2;
                auVar19._12_4_ = uVar2;
                auVar19._16_4_ = uVar2;
                auVar19._20_4_ = uVar2;
                auVar19._24_4_ = uVar2;
                auVar19._28_4_ = uVar2;
                auVar42 = vfmadd213ps_avx512vl(auVar53,auVar37,auVar19);
                uVar2 = *(undefined4 *)(uVar27 + 0x1c0 + lVar25);
                auVar54._4_4_ = uVar2;
                auVar54._0_4_ = uVar2;
                auVar54._8_4_ = uVar2;
                auVar54._12_4_ = uVar2;
                auVar54._16_4_ = uVar2;
                auVar54._20_4_ = uVar2;
                auVar54._24_4_ = uVar2;
                auVar54._28_4_ = uVar2;
                uVar2 = *(undefined4 *)(uVar27 + 0x100 + lVar25);
                auVar20._4_4_ = uVar2;
                auVar20._0_4_ = uVar2;
                auVar20._8_4_ = uVar2;
                auVar20._12_4_ = uVar2;
                auVar20._16_4_ = uVar2;
                auVar20._20_4_ = uVar2;
                auVar20._24_4_ = uVar2;
                auVar20._28_4_ = uVar2;
                auVar43 = vfmadd213ps_avx512vl(auVar54,auVar37,auVar20);
                auVar44 = vfmadd213ps_avx512vl(auVar35,auVar55._0_32_,auVar60._0_32_);
                auVar45 = vfmadd213ps_avx512vl(auVar39,auVar56._0_32_,auVar61._0_32_);
                auVar46 = vfmadd213ps_avx512vl(auVar40,auVar57._0_32_,auVar62._0_32_);
                auVar40 = vfmadd213ps_avx512vl(auVar41,auVar55._0_32_,auVar60._0_32_);
                auVar41 = vfmadd213ps_avx512vl(auVar42,auVar56._0_32_,auVar61._0_32_);
                auVar42 = vfmadd213ps_avx512vl(auVar43,auVar57._0_32_,auVar62._0_32_);
                auVar35 = vpminsd_avx2(auVar44,auVar40);
                auVar39 = vpminsd_avx2(auVar45,auVar41);
                auVar35 = vpmaxsd_avx2(auVar35,auVar39);
                auVar39 = vpminsd_avx2(auVar46,auVar42);
                auVar35 = vpmaxsd_avx2(auVar35,auVar39);
                auVar39 = vpmaxsd_avx2(auVar44,auVar40);
                auVar40 = vpmaxsd_avx2(auVar45,auVar41);
                auVar41 = vpminsd_avx2(auVar39,auVar40);
                auVar39 = vpmaxsd_avx2(auVar46,auVar42);
                auVar40 = vpmaxsd_avx2(auVar35,auVar59._0_32_);
                auVar39 = vpminsd_avx512vl(auVar39,auVar38);
                auVar39 = vpminsd_avx2(auVar41,auVar39);
                uVar34 = vcmpps_avx512vl(auVar40,auVar39,2);
                if ((uVar28 & 7) == 6) {
                  uVar2 = *(undefined4 *)(uVar27 + 0x1e0 + lVar25);
                  auVar21._4_4_ = uVar2;
                  auVar21._0_4_ = uVar2;
                  auVar21._8_4_ = uVar2;
                  auVar21._12_4_ = uVar2;
                  auVar21._16_4_ = uVar2;
                  auVar21._20_4_ = uVar2;
                  auVar21._24_4_ = uVar2;
                  auVar21._28_4_ = uVar2;
                  uVar26 = vcmpps_avx512vl(auVar37,auVar21,0xd);
                  uVar2 = *(undefined4 *)(uVar27 + 0x200 + lVar25);
                  auVar22._4_4_ = uVar2;
                  auVar22._0_4_ = uVar2;
                  auVar22._8_4_ = uVar2;
                  auVar22._12_4_ = uVar2;
                  auVar22._16_4_ = uVar2;
                  auVar22._20_4_ = uVar2;
                  auVar22._24_4_ = uVar2;
                  auVar22._28_4_ = uVar2;
                  uVar12 = vcmpps_avx512vl(auVar37,auVar22,1);
                  uVar34 = uVar34 & uVar26 & uVar12;
                }
                uVar26 = vcmpps_avx512vl(auVar38,auVar36,6);
                uVar34 = uVar34 & uVar26;
                if ((byte)uVar34 != 0) {
                  auVar35 = vblendmps_avx512vl(auVar58._0_32_,auVar35);
                  bVar3 = (bool)((byte)uVar34 & 1);
                  auVar47._0_4_ = (uint)bVar3 * auVar35._0_4_ | (uint)!bVar3 * auVar37._0_4_;
                  bVar3 = (bool)((byte)(uVar34 >> 1) & 1);
                  auVar47._4_4_ = (uint)bVar3 * auVar35._4_4_ | (uint)!bVar3 * auVar37._4_4_;
                  bVar3 = (bool)((byte)(uVar34 >> 2) & 1);
                  auVar47._8_4_ = (uint)bVar3 * auVar35._8_4_ | (uint)!bVar3 * auVar37._8_4_;
                  bVar3 = (bool)((byte)(uVar34 >> 3) & 1);
                  auVar47._12_4_ = (uint)bVar3 * auVar35._12_4_ | (uint)!bVar3 * auVar37._12_4_;
                  bVar3 = (bool)((byte)(uVar34 >> 4) & 1);
                  auVar47._16_4_ = (uint)bVar3 * auVar35._16_4_ | (uint)!bVar3 * auVar37._16_4_;
                  bVar3 = (bool)((byte)(uVar34 >> 5) & 1);
                  auVar47._20_4_ = (uint)bVar3 * auVar35._20_4_ | (uint)!bVar3 * auVar37._20_4_;
                  bVar3 = (bool)((byte)(uVar34 >> 6) & 1);
                  auVar47._24_4_ = (uint)bVar3 * auVar35._24_4_ | (uint)!bVar3 * auVar37._24_4_;
                  bVar3 = SUB81(uVar34 >> 7,0);
                  auVar47._28_4_ = (uint)bVar3 * auVar35._28_4_ | (uint)!bVar3 * auVar37._28_4_;
                  auVar35 = auVar48._0_32_;
                  uVar11 = vcmpps_avx512vl(auVar47,auVar35,1);
                  uVar34 = uVar29;
                  uVar26 = uVar32;
                  auVar37 = auVar47;
                  if (((char)uVar11 == '\0') ||
                     (uVar34 = uVar32, uVar26 = uVar29, auVar37 = auVar35, auVar35 = auVar47,
                     uVar29 != 8)) {
                    auVar47 = auVar35;
                    uVar23 = uVar23 + 1;
                    *puVar30 = uVar26;
                    puVar30 = puVar30 + 1;
                    *pauVar31 = auVar37;
                    pauVar31 = pauVar31 + 1;
                    uVar32 = uVar34;
                  }
                  auVar48 = ZEXT3264(auVar47);
                  uVar29 = uVar32;
                }
                lVar25 = lVar25 + 4;
              } while (lVar25 != 0);
              if (uVar29 == 8) goto LAB_007cdf6c;
              if (1 < uVar23) {
                auVar35 = pauVar31[-2];
                auVar36 = pauVar31[-1];
                uVar11 = vcmpps_avx512vl(auVar35,auVar36,1);
                auVar37 = auVar36;
                if ((char)uVar11 != '\0') {
                  pauVar31[-2] = auVar36;
                  pauVar31[-1] = auVar35;
                  auVar13 = vpermilps_avx(*(undefined1 (*) [16])(puVar30 + -2),0x4e);
                  *(undefined1 (*) [16])(puVar30 + -2) = auVar13;
                  auVar37 = auVar35;
                  auVar35 = auVar36;
                }
                if (uVar23 != 2) {
                  auVar36 = pauVar31[-3];
                  uVar11 = vcmpps_avx512vl(auVar36,auVar37,1);
                  if ((char)uVar11 != '\0') {
                    pauVar31[-3] = auVar37;
                    pauVar31[-1] = auVar36;
                    uVar23 = puVar30[-3];
                    puVar30[-3] = puVar30[-1];
                    puVar30[-1] = uVar23;
                    auVar36 = auVar37;
                  }
                  uVar11 = vcmpps_avx512vl(auVar36,auVar35,1);
                  if ((char)uVar11 != '\0') {
                    pauVar31[-3] = auVar35;
                    pauVar31[-2] = auVar36;
                    auVar13 = vpermilps_avx(*(undefined1 (*) [16])(puVar30 + -3),0x4e);
                    *(undefined1 (*) [16])(puVar30 + -3) = auVar13;
                  }
                }
              }
            }
            if (uVar29 == 0xfffffffffffffff8) {
              return;
            }
            uVar23 = vcmpps_avx512vl(auVar38,auVar36,6);
            uVar33 = (ushort)uVar23;
            if ((byte)uVar23 != 0) {
              uVar27 = (ulong)(uVar28 & 0xf);
              if (uVar27 != 8) {
                lVar25 = 0;
                local_5860 = auVar38;
                do {
                  local_5988.geomID = *(uint *)((uVar29 & 0xfffffffffffffff0) + lVar25 * 8);
                  local_5958 = (context->scene->geometries).items[local_5988.geomID].ptr;
                  uVar28 = local_5958->mask;
                  auVar36._4_4_ = uVar28;
                  auVar36._0_4_ = uVar28;
                  auVar36._8_4_ = uVar28;
                  auVar36._12_4_ = uVar28;
                  auVar36._16_4_ = uVar28;
                  auVar36._20_4_ = uVar28;
                  auVar36._24_4_ = uVar28;
                  auVar36._28_4_ = uVar28;
                  uVar32 = vptestmd_avx512vl(auVar36,*(undefined1 (*) [32])(ray + 0x120));
                  uVar32 = uVar23 & 0xff & uVar32;
                  if ((char)uVar32 != '\0') {
                    local_5988.primID = *(uint *)((uVar29 & 0xfffffffffffffff0) + 4 + lVar25 * 8);
                    local_5840 = vpmovm2d_avx512vl(uVar32);
                    local_5988.valid = (int *)local_5840;
                    local_5988.geometryUserPtr = local_5958->userPtr;
                    local_5988.context = context->user;
                    local_5988.N = 8;
                    local_5950 = 0;
                    local_5948 = context->args;
                    pp_Var24 = (_func_int **)local_5948->intersect;
                    if (pp_Var24 == (_func_int **)0x0) {
                      pp_Var24 = local_5958[1].super_RefCount._vptr_RefCount;
                    }
                    local_5988.rayhit = (RTCRayHitN *)ray;
                    (*(code *)pp_Var24)(&local_5988);
                    auVar55 = ZEXT3264(local_5880);
                    auVar56 = ZEXT3264(local_58a0);
                    auVar57 = ZEXT3264(local_58c0);
                    auVar58 = ZEXT3264(CONCAT428(0x7f800000,
                                                 CONCAT424(0x7f800000,
                                                           CONCAT420(0x7f800000,
                                                                     CONCAT416(0x7f800000,
                                                                               CONCAT412(0x7f800000,
                                                                                         CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                    auVar59 = ZEXT3264(local_58e0);
                    auVar60 = ZEXT3264(local_5900);
                    auVar61 = ZEXT3264(local_5920);
                    auVar62 = ZEXT3264(local_5940);
                    auVar63 = ZEXT3264(local_5860);
                  }
                  auVar38 = auVar63._0_32_;
                  lVar25 = lVar25 + 1;
                } while (uVar27 - 8 != lVar25);
              }
              bVar3 = (bool)((byte)uVar23 & 1);
              bVar4 = (bool)((byte)(uVar33 >> 1) & 1);
              bVar5 = (bool)((byte)(uVar33 >> 2) & 1);
              bVar6 = (bool)((byte)(uVar33 >> 3) & 1);
              bVar7 = (bool)((byte)(uVar33 >> 4) & 1);
              bVar8 = (bool)((byte)(uVar33 >> 5) & 1);
              bVar9 = (bool)((byte)(uVar33 >> 6) & 1);
              bVar10 = (bool)((byte)(uVar33 >> 7) & 1);
              auVar63 = ZEXT3264(CONCAT428((uint)bVar10 * *(int *)(ray + 0x11c) |
                                           (uint)!bVar10 * auVar38._28_4_,
                                           CONCAT424((uint)bVar9 * *(int *)(ray + 0x118) |
                                                     (uint)!bVar9 * auVar38._24_4_,
                                                     CONCAT420((uint)bVar8 * *(int *)(ray + 0x114) |
                                                               (uint)!bVar8 * auVar38._20_4_,
                                                               CONCAT416((uint)bVar7 *
                                                                         *(int *)(ray + 0x110) |
                                                                         (uint)!bVar7 *
                                                                         auVar38._16_4_,
                                                                         CONCAT412((uint)bVar6 *
                                                                                   *(int *)(ray + 
                                                  0x10c) | (uint)!bVar6 * auVar38._12_4_,
                                                  CONCAT48((uint)bVar5 * *(int *)(ray + 0x108) |
                                                           (uint)!bVar5 * auVar38._8_4_,
                                                           CONCAT44((uint)bVar4 *
                                                                    *(int *)(ray + 0x104) |
                                                                    (uint)!bVar4 * auVar38._4_4_,
                                                                    (uint)bVar3 *
                                                                    *(int *)(ray + 0x100) |
                                                                    (uint)!bVar3 * auVar38._0_4_))))
                                                  ))));
            }
          }
LAB_007cdf6c:
          uVar29 = puVar30[-1];
          puVar30 = puVar30 + -1;
        } while (uVar29 != 0xfffffffffffffff8);
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect(vint<K>* __restrict__ valid_i,
                                                                                               Accel::Intersectors* __restrict__ This,
                                                                                               RayHitK<K>& __restrict__ ray,
                                                                                               RayQueryContext* __restrict__ context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
            
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        intersectCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);

#if defined(__AVX__)
      STAT3(normal.trav_hit_boxes[popcnt(movemask(valid))], 1, 1, 1);
#endif

      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      if (single)
      {
        tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));
        
        for (; valid_bits!=0; ) {
          const size_t i = bscf(valid_bits);
          intersect1(This, bvh, bvh->root, i, pre, ray, tray, context);
        }
        return;
      }

       /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      /* test whether we have ray with opposing direction signs in the packet */
      bool split = false;
      {
        size_t bits = valid_bits;
        vbool<K> vsplit( false );
        do
        {
          const size_t valid_index = bsf(bits);
          vbool<K> octant_valid = octant[valid_index] == octant;
          bits &= ~(size_t)movemask(octant_valid);
          vsplit |= vint<K>(octant[valid_index]) == (octant^vint<K>(0x7));
        } while (bits);
        if (any(vsplit)) split = true;
      }

      do
      {
        const size_t valid_index = bsf(valid_bits);
        const vint<K> diff_octant = vint<K>(octant[valid_index])^octant;
        const vint<K> count_diff_octant = \
          ((diff_octant >> 2) & 1) +
          ((diff_octant >> 1) & 1) +
          ((diff_octant >> 0) & 1);

        vbool<K> octant_valid = (count_diff_octant <= 1) & (octant != vint<K>(0xffffffff));
        if (!single || !split) octant_valid = valid; // deactivate octant sorting in pure chunk mode, otherwise instance traversal performance goes down 


        octant = select(octant_valid,vint<K>(0xffffffff),octant);
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar , vfloat<K>(neg_inf));

        /* allocate stack and push root node */
        vfloat<K> stack_near[stackSizeChunk];
        NodeRef stack_node[stackSizeChunk];
        stack_node[0] = BVH::invalidNode;
        stack_near[0] = inf;
        stack_node[1] = bvh->root;
        stack_near[1] = tray.tnear;
        NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
        NodeRef* __restrict__ sptr_node = stack_node + 2;
        vfloat<K>* __restrict__ sptr_near = stack_near + 2;

        while (1) pop:
        {
          /* pop next node from stack */
          assert(sptr_node > stack_node);
          sptr_node--;
          sptr_near--;
          NodeRef cur = *sptr_node;
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* cull node if behind closest hit point */
          vfloat<K> curDist = *sptr_near;
          const vbool<K> active = curDist < tray.tfar;
          if (unlikely(none(active)))
            continue;

          /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
          if (single)
#endif
          {
            size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
            if (unlikely(popcnt(bits) <= switchThreshold))
#endif
            {
              for (; bits!=0; ) {
                const size_t i = bscf(bits);
                intersect1(This, bvh, cur, i, pre, ray, tray, context);
              }
              tray.tfar = min(tray.tfar, ray.tfar);
              continue;
            }
          }
#endif
          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            const vbool<K> valid_node = tray.tfar > curDist;
            STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const BaseNode* __restrict__ const node = nodeRef.baseNode();

            /* set cur to invalid */
            cur = BVH::emptyNode;
            curDist = pos_inf;

            size_t num_child_hits = 0;

            for (unsigned i = 0; i < N; i++)
            {
              const NodeRef child = node->children[i];
              if (unlikely(child == BVH::emptyNode)) break;
              vfloat<K> lnearP;
              vbool<K> lhit = valid_node;
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              /* if we hit the child we choose to continue with that child if it
                 is closer than the current next child, or we push it onto the stack */
              if (likely(any(lhit)))
              {                                
                assert(sptr_node < stackEnd);
                assert(child != BVH::emptyNode);
                const vfloat<K> childDist = select(lhit, lnearP, inf);
                /* push cur node onto stack and continue with hit child */
                if (any(childDist < curDist))
                {
                  if (likely(cur != BVH::emptyNode)) {
                    num_child_hits++;
                    *sptr_node = cur; sptr_node++;
                    *sptr_near = curDist; sptr_near++;
                  }
                  curDist = childDist;
                  cur = child;
                }

                /* push hit child onto stack */
                else {
                  num_child_hits++;                  
                  *sptr_node = child; sptr_node++;
                  *sptr_near = childDist; sptr_near++;
                }
              }
            }

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[num_child_hits], 1, 1, 1);
#endif

            if (unlikely(cur == BVH::emptyNode))
              goto pop;
            
            /* improved distance sorting for 3 or more hits */
            if (unlikely(num_child_hits >= 2))
            {
              if (any(sptr_near[-2] < sptr_near[-1]))
              {
                std::swap(sptr_near[-2],sptr_near[-1]);
                std::swap(sptr_node[-2],sptr_node[-1]);
              }
              if (unlikely(num_child_hits >= 3))
              {
                if (any(sptr_near[-3] < sptr_near[-1]))
                {
                  std::swap(sptr_near[-3],sptr_near[-1]);
                  std::swap(sptr_node[-3],sptr_node[-1]);
                }
                if (any(sptr_near[-3] < sptr_near[-2]))
                {
                  std::swap(sptr_near[-3],sptr_near[-2]);
                  std::swap(sptr_node[-3],sptr_node[-2]);
                }
              }
            }

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
            if (single)
            {
              // seems to be the best place for testing utilization
              if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
              {
                *sptr_node++ = cur;
                *sptr_near++ = curDist;
                goto pop;
              }
            }
#endif
          }

          /* return if stack is empty */
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* intersect leaf */
          assert(cur != BVH::emptyNode);
          const vbool<K> valid_leaf = tray.tfar > curDist;
          STAT3(normal.trav_leaves, 1, popcnt(valid_leaf), K);
          if (unlikely(none(valid_leaf))) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          PrimitiveIntersectorK::intersect(valid_leaf, This, pre, ray, context, prim, items, tray, lazy_node);
          tray.tfar = select(valid_leaf, ray.tfar, tray.tfar);

          if (unlikely(lazy_node)) {
            *sptr_node = lazy_node; sptr_node++;
            *sptr_near = neg_inf;   sptr_near++;
          }
        }
      } while(valid_bits);
    }